

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GetLine(io_private *pDev,jx9_int64 *pLen,char **pzLine)

{
  char *pcVar1;
  char *zPtr;
  char *zEnd;
  char *zIn;
  char **pzLine_local;
  jx9_int64 *pLen_local;
  io_private *pDev_local;
  
  pcVar1 = (char *)((long)(pDev->sBuffer).pBlob + (ulong)pDev->nOfft);
  zEnd = pcVar1;
  while( true ) {
    if (pcVar1 + ((pDev->sBuffer).nByte - pDev->nOfft) <= zEnd) {
      return -6;
    }
    if (*zEnd == '\n') break;
    zEnd = zEnd + 1;
  }
  *pLen = (jx9_int64)(zEnd + (1 - (long)pcVar1));
  *pzLine = pcVar1;
  return 0;
}

Assistant:

static sxi32 GetLine(io_private *pDev, jx9_int64 *pLen, const char **pzLine)
{
	const char *zIn, *zEnd, *zPtr;
	zIn = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
	zEnd = &zIn[SyBlobLength(&pDev->sBuffer)-pDev->nOfft];
	zPtr = zIn;
	while( zIn < zEnd ){
		if( zIn[0] == '\n' ){
			/* Line found */
			zIn++; /* Include the line ending as requested by the JX9 specification */
			*pLen = (jx9_int64)(zIn-zPtr);
			*pzLine = zPtr;
			return SXRET_OK;
		}
		zIn++;
	}
	/* No line were found */
	return SXERR_NOTFOUND;
}